

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O1

int get_path_component(char *name,size_t n,char *fn)

{
  int iVar1;
  char *pcVar2;
  size_t __n;
  
  pcVar2 = strchr((char *)n,0x2f);
  if (pcVar2 == (char *)0x0) {
    __n = strlen((char *)n);
    if (__n == 0) {
      return 0;
    }
  }
  else {
    __n = (long)pcVar2 - n;
  }
  iVar1 = -1;
  if (__n < 0x100) {
    memcpy(name,(void *)n,__n);
    name[__n] = '\0';
    iVar1 = (int)__n;
  }
  return iVar1;
}

Assistant:

static int
get_path_component(char *name, size_t n, const char *fn)
{
	char *p;
	size_t l;

	p = strchr(fn, '/');
	if (p == NULL) {
		if ((l = strlen(fn)) == 0)
			return (0);
	} else
		l = p - fn;
	if (l > n -1)
		return (-1);
	memcpy(name, fn, l);
	name[l] = '\0';

	return ((int)l);
}